

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O0

Lazy<bool> __thiscall
cinatra::coro_http_connection::write_multipart
          (coro_http_connection *this,string_view part_data,string_view content_type)

{
  basic_string_view<char,_std::char_traits<char>_> data;
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  type *this_00;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  LazyBase<bool,_false> in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  type_conflict2 *_;
  type *ec;
  value_type *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  coro_http_connection *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  int iVar3;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  allocator<char> local_a9 [121];
  undefined8 local_30;
  undefined8 local_28;
  size_t local_20;
  undefined8 local_18;
  
  local_30 = in_R8;
  local_28 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RCX;
  puVar2 = (undefined8 *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<bool>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = write_multipart;
    puVar2[1] = write_multipart;
    puVar2[0x16] = in_RSI;
    ((basic_string_view<char,_std::char_traits<char>_> *)(puVar2 + 0xe))->_M_len = local_20;
    puVar2[0xf] = local_18;
    puVar2[0x10] = local_30;
    puVar2[0x11] = local_28;
    async_simple::coro::detail::LazyPromise<bool>::LazyPromise
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    async_simple::coro::detail::LazyPromise<bool>::get_return_object
              ((LazyPromise<bool> *)in_stack_fffffffffffffd18);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xbd));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xbd));
      coro_http_response::set_delay((coro_http_response *)(puVar2[0x16] + 0xf48),true);
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::clear
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x3fde5d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      std::allocator<char>::~allocator(local_a9);
      coro_http_response::get_boundary((coro_http_response *)0x3fdec8);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)(puVar2 + 0xe));
      std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      asio::const_buffer::const_buffer
                ((const_buffer *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (mutable_buffer *)in_stack_fffffffffffffcf8);
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8);
      data._M_len._4_4_ = in_stack_fffffffffffffd0c;
      data._M_len._0_4_ = in_stack_fffffffffffffd08;
      data._M_str._0_4_ = in_stack_fffffffffffffd10;
      data._M_str._4_4_ = in_stack_fffffffffffffd14;
      asio::buffer<char,std::char_traits<char>>(data);
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8);
      asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8);
      async_write<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>&>
                (in_stack_fffffffffffffd18,
                 (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      bVar1 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar2 + 0x14));
      if (bVar1) {
        puVar2[0x12] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                       (puVar2 + 0x14);
        async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
        awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
        ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3fe3b1);
        async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                  ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3fe3be);
        if (iVar3 == 0) {
          this_00 = std::get<0ul,std::error_code,unsigned_long>
                              ((pair<std::error_code,_unsigned_long> *)0x3fe3e2);
          std::get<1ul,std::error_code,unsigned_long>
                    ((pair<std::error_code,_unsigned_long> *)0x3fe3f7);
          std::error_code::operator_cast_to_bool(this_00);
          async_simple::coro::detail::LazyPromise<bool>::return_value<bool>
                    ((LazyPromise<bool> *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     (bool *)in_stack_fffffffffffffcf8);
          iVar3 = 3;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        if (iVar3 == 3) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xbe));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xbc) = 2;
            write_multipart((void *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (void *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xbe));
        }
        async_simple::coro::detail::LazyPromise<bool>::~LazyPromise((LazyPromise<bool> *)0x3fe5e2);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xc0);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xbc) = 1;
        write_multipart((void *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                        in_stack_fffffffffffffd18);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xbc) = 0;
      write_multipart((void *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                      (void *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    }
  }
  return (Lazy<bool>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<bool> write_multipart(
      std::string_view part_data, std::string_view content_type) {
    response_.set_delay(true);
    buffers_.clear();
    std::string part_head = "--";
    part_head.append(response_.get_boundary()).append(CRCF);
    part_head.append("Content-Type: ").append(content_type).append(CRCF);
    part_head.append("Content-Length: ")
        .append(std::to_string(part_data.size()))
        .append(TWO_CRCF);

    buffers_.push_back(asio::buffer(part_head));
    buffers_.push_back(asio::buffer(part_data));
    buffers_.push_back(asio::buffer(CRCF));

    auto [ec, _] = co_await async_write(buffers_);
    co_return !ec;
  }